

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  uchar uVar1;
  bool bVar2;
  byte bVar3;
  stbi_uc sVar4;
  int iVar5;
  uchar *puVar6;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  int in_R8D;
  uchar temp_1;
  uchar *tga_pixel;
  uchar temp;
  int index2;
  int index1;
  int pal_idx;
  int RLE_cmd;
  stbi_uc *pal_entry;
  stbi_uc *tga_row;
  int row;
  int read_next_pixel;
  int RLE_repeating;
  int RLE_count;
  uchar raw_data [4];
  int j;
  int i;
  uchar *tga_palette;
  uchar *tga_data;
  int tga_inverted;
  int tga_rgb16;
  int tga_comp;
  int tga_bits_per_pixel;
  int tga_height;
  int tga_width;
  int tga_y_origin;
  int tga_x_origin;
  int tga_palette_bits;
  int tga_palette_len;
  int tga_palette_start;
  int tga_is_RLE;
  int tga_image_type;
  int tga_indexed;
  int tga_offset;
  int in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  stbi__context *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  uint in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  uint uVar7;
  uint in_stack_ffffffffffffff44;
  uchar *in_stack_ffffffffffffff48;
  int local_9c;
  int local_98;
  uchar local_94 [4];
  int local_90;
  int local_8c;
  uchar *local_88;
  uchar *local_80;
  uint local_74;
  int local_70;
  int local_6c;
  uint local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  uint local_54;
  int local_50;
  int local_4c;
  int local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  int local_2c;
  int *local_28;
  int *local_20;
  int *local_18;
  uchar *local_8;
  
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar3 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
  ;
  local_3c = (uint)bVar3;
  bVar3 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
  ;
  local_40 = (uint)bVar3;
  bVar3 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
  ;
  local_44 = (uint)bVar3;
  local_48 = 0;
  local_4c = stbi__get16le((stbi__context *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  local_50 = stbi__get16le((stbi__context *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  bVar3 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
  ;
  local_54 = (uint)bVar3;
  local_58 = stbi__get16le((stbi__context *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  local_5c = stbi__get16le((stbi__context *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  local_60 = stbi__get16le((stbi__context *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  local_64 = stbi__get16le((stbi__context *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  bVar3 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
  ;
  local_68 = (uint)bVar3;
  local_70 = 0;
  bVar3 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
  ;
  local_74 = (uint)bVar3;
  local_88 = (uchar *)0x0;
  memset(local_94,0,4);
  local_98 = 0;
  local_9c = 0;
  bVar2 = true;
  if (7 < (int)local_44) {
    local_44 = local_44 - 8;
    local_48 = 1;
  }
  local_74 = 1 - ((int)local_74 >> 5 & 1U);
  if (local_40 == 0) {
    local_6c = stbi__tga_get_comp(local_68,(uint)(local_44 == 3),&local_70);
  }
  else {
    local_6c = stbi__tga_get_comp(local_54,0,&local_70);
  }
  if (local_6c == 0) {
    stbi__err("Can\'t find out TGA pixelformat");
    local_8 = (uchar *)0x0;
  }
  else {
    *local_18 = local_60;
    *local_20 = local_64;
    if (local_28 != (int *)0x0) {
      *local_28 = local_6c;
    }
    iVar5 = stbi__mad3sizes_valid
                      (in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c
                       ,in_stack_ffffffffffffff18);
    if (iVar5 == 0) {
      stbi__err("Corrupt TGA");
      local_8 = (uchar *)0x0;
    }
    else {
      local_80 = (uchar *)stbi__malloc_mad3(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,0,
                                            0x19782f);
      if (local_80 == (uchar *)0x0) {
        stbi__err("Out of memory");
        local_8 = (uchar *)0x0;
      }
      else {
        stbi__skip((stbi__context *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff1c);
        if (((local_40 == 0) && (local_48 == 0)) && (local_70 == 0)) {
          for (local_8c = 0; local_8c < local_64; local_8c = local_8c + 1) {
            iVar5 = local_8c;
            if (local_74 != 0) {
              iVar5 = (local_64 - local_8c) + -1;
            }
            stbi__getn(in_stack_ffffffffffffff28,
                       (stbi_uc *)CONCAT44(in_stack_ffffffffffffff24,iVar5),
                       in_stack_ffffffffffffff1c);
          }
        }
        else {
          if (local_40 != 0) {
            stbi__skip((stbi__context *)
                       CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff1c);
            puVar6 = (uchar *)stbi__malloc_mad2(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,
                                                0);
            local_88 = puVar6;
            if (puVar6 == (uchar *)0x0) {
              free(local_80);
              stbi__err("Out of memory");
              return (void *)0x0;
            }
            if (local_70 == 0) {
              iVar5 = stbi__getn(in_stack_ffffffffffffff28,
                                 (stbi_uc *)
                                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                 in_stack_ffffffffffffff1c);
              if (iVar5 == 0) {
                free(local_80);
                free(local_88);
                stbi__err("Corrupt TGA");
                return (void *)0x0;
              }
            }
            else {
              for (local_8c = 0; in_stack_ffffffffffffff48 = puVar6, local_8c < local_50;
                  local_8c = local_8c + 1) {
                stbi__tga_read_rgb16
                          ((stbi__context *)
                           CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                           (stbi_uc *)in_stack_ffffffffffffff28);
                puVar6 = puVar6 + local_6c;
              }
            }
          }
          for (local_8c = 0; local_8c < local_60 * local_64; local_8c = local_8c + 1) {
            if (local_48 == 0) {
              bVar2 = true;
            }
            else if (local_98 == 0) {
              bVar3 = stbi__get8((stbi__context *)
                                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
              in_stack_ffffffffffffff44 = (uint)bVar3;
              local_98 = (in_stack_ffffffffffffff44 & 0x7f) + 1;
              local_9c = (int)in_stack_ffffffffffffff44 >> 7;
              bVar2 = true;
            }
            else if (local_9c == 0) {
              bVar2 = true;
            }
            if (bVar2) {
              if (local_40 == 0) {
                if (local_70 == 0) {
                  for (local_90 = 0; local_90 < local_6c; local_90 = local_90 + 1) {
                    sVar4 = stbi__get8((stbi__context *)
                                       CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
                                      );
                    local_94[local_90] = sVar4;
                  }
                }
                else {
                  stbi__tga_read_rgb16
                            ((stbi__context *)
                             CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                             (stbi_uc *)in_stack_ffffffffffffff28);
                }
              }
              else {
                if (local_68 == 8) {
                  bVar3 = stbi__get8((stbi__context *)
                                     CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
                  in_stack_ffffffffffffff1c = (uint)bVar3;
                }
                else {
                  in_stack_ffffffffffffff1c =
                       stbi__get16le((stbi__context *)
                                     CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
                }
                uVar7 = in_stack_ffffffffffffff1c;
                if (local_50 <= (int)in_stack_ffffffffffffff1c) {
                  uVar7 = 0;
                }
                in_stack_ffffffffffffff40 = local_6c * uVar7;
                for (local_90 = 0; local_90 < local_6c; local_90 = local_90 + 1) {
                  local_94[local_90] = local_88[in_stack_ffffffffffffff40 + local_90];
                }
              }
              bVar2 = false;
            }
            for (local_90 = 0; local_90 < local_6c; local_90 = local_90 + 1) {
              local_80[local_8c * local_6c + local_90] = local_94[local_90];
            }
            local_98 = local_98 + -1;
          }
          if (local_74 != 0) {
            for (local_90 = 0; local_90 * 2 < local_64; local_90 = local_90 + 1) {
              in_stack_ffffffffffffff3c = local_90 * local_60 * local_6c;
              in_stack_ffffffffffffff38 = ((local_64 + -1) - local_90) * local_60 * local_6c;
              for (local_8c = local_60 * local_6c; 0 < local_8c; local_8c = local_8c + -1) {
                uVar1 = local_80[(int)in_stack_ffffffffffffff3c];
                local_80[(int)in_stack_ffffffffffffff3c] = local_80[(int)in_stack_ffffffffffffff38];
                local_80[(int)in_stack_ffffffffffffff38] = uVar1;
                in_stack_ffffffffffffff3c = in_stack_ffffffffffffff3c + 1;
                in_stack_ffffffffffffff38 = in_stack_ffffffffffffff38 + 1;
              }
            }
          }
          if (local_88 != (uchar *)0x0) {
            free(local_88);
          }
        }
        if ((2 < local_6c) && (local_70 == 0)) {
          puVar6 = local_80;
          for (local_8c = 0; local_8c < local_60 * local_64; local_8c = local_8c + 1) {
            uVar1 = *puVar6;
            *puVar6 = puVar6[2];
            puVar6[2] = uVar1;
            puVar6 = puVar6 + local_6c;
          }
        }
        if ((local_2c != 0) && (local_2c != local_6c)) {
          local_80 = stbi__convert_format
                               (in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                                in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                                in_stack_ffffffffffffff38);
        }
        local_8 = local_80;
      }
    }
  }
  return local_8;
}

Assistant:

static void *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp, tga_rgb16=0;
   int tga_inverted = stbi__get8(s);
   // int tga_alpha_bits = tga_inverted & 15; // the 4 lowest bits - unused (useless?)
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4] = {0};
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;
   STBI_NOTUSED(ri);
   STBI_NOTUSED(tga_x_origin); // @TODO
   STBI_NOTUSED(tga_y_origin); // @TODO

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed ) tga_comp = stbi__tga_get_comp(tga_palette_bits, 0, &tga_rgb16);
   else tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3), &tga_rgb16);

   if(!tga_comp) // shouldn't really happen, stbi__tga_test() should have ensured basic consistency
      return stbi__errpuc("bad format", "Can't find out TGA pixelformat");

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   if (!stbi__mad3sizes_valid(tga_width, tga_height, tga_comp, 0))
      return stbi__errpuc("too large", "Corrupt TGA");

   tga_data = (unsigned char*)stbi__malloc_mad3(tga_width, tga_height, tga_comp, 0);
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE && !tga_rgb16 ) {
      for (i=0; i < tga_height; ++i) {
         int row = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + row*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc_mad2(tga_palette_len, tga_comp, 0);
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (tga_rgb16) {
            stbi_uc *pal_entry = tga_palette;
            STBI_ASSERT(tga_comp == STBI_rgb);
            for (i=0; i < tga_palette_len; ++i) {
               stbi__tga_read_rgb16(s, pal_entry);
               pal_entry += tga_comp;
            }
         } else if (!stbi__getn(s, tga_palette, tga_palette_len * tga_comp)) {
               STBI_FREE(tga_data);
               STBI_FREE(tga_palette);
               return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               // read in index, then perform the lookup
               int pal_idx = (tga_bits_per_pixel == 8) ? stbi__get8(s) : stbi__get16le(s);
               if ( pal_idx >= tga_palette_len ) {
                  // invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_comp;
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else if(tga_rgb16) {
               STBI_ASSERT(tga_comp == STBI_rgb);
               stbi__tga_read_rgb16(s, raw_data);
            } else {
               //   read in the data raw
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB - if the source data was RGB16, it already is in the right order
   if (tga_comp >= 3 && !tga_rgb16)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   STBI_NOTUSED(tga_palette_start);
   //   OK, done
   return tga_data;
}